

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O1

void __thiscall
(anonymous_namespace)::buildCommand((anonymous_namespace)::BuildContext&,llbuild::ninja::Command*)::
NinjaCommandTask::provideValue(llbuild::core::TaskInterface,unsigned_long,llbuild::core::
KeyType_const&,std::vector<unsigned_char,std::allocator<unsigned_char>_>_const__
          (void *this,TaskInterface param_1,uintptr_t inputID,KeyType *key,ValueType *valueData)

{
  ulong uVar1;
  uint64_t uVar2;
  bool bVar3;
  FileInfo *this_00;
  BuildValue value;
  BuildValue local_78;
  
  anon_unknown.dwarf_b1e20::BuildValue::fromValue(&local_78,valueData);
  if (local_78.numOutputInfos < 2) {
    if ((local_78.kind & ~SuccessfulCommand) == ExistingInput) {
      this_00 = anon_unknown.dwarf_b1e20::BuildValue::getOutputInfo(&local_78);
      bVar3 = llbuild::basic::FileInfo::isMissing(this_00);
      if (bVar3) {
        *(undefined1 *)((long)this + 0x1a) = 0;
      }
      else {
        uVar1 = (this_00->modTime).seconds;
        if ((*(ulong *)((long)this + 0x28) < uVar1) ||
           ((*(ulong *)((long)this + 0x28) == uVar1 &&
            (*(ulong *)((long)this + 0x30) < (this_00->modTime).nanoseconds)))) {
          uVar2 = (this_00->modTime).nanoseconds;
          *(uint64_t *)((long)this + 0x28) = (this_00->modTime).seconds;
          *(uint64_t *)((long)this + 0x30) = uVar2;
        }
      }
    }
    else {
      *(undefined1 *)((long)this + 0x18) = 1;
      if (local_78.kind == MissingInput) {
        *(undefined1 *)((long)this + 0x19) = 1;
        anon_unknown.dwarf_b1e20::BuildContext::emitError
                  (*(BuildContext **)((long)this + 8),"missing input \'%s\' and no rule to build it"
                   ,*(undefined8 *)
                     (*(long *)(*(long *)(*(long *)((long)this + 0x10) + 0x28) + inputID * 8) + 0x20
                     ));
      }
    }
    if ((1 < local_78.numOutputInfos) &&
       ((FileInfo *)local_78.valueData.asOutputInfo.device != (FileInfo *)0x0)) {
      operator_delete__(local_78.valueData.asOutputInfos);
    }
    return;
  }
  __assert_fail("!value.hasMultipleOutputs()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp"
                ,0x3e0,
                "virtual void (anonymous namespace)::buildCommand(BuildContext &, ninja::Command *)::NinjaCommandTask::provideValue(core::TaskInterface, uintptr_t, const core::KeyType &, const core::ValueType &)"
               );
}

Assistant:

virtual void provideValue(core::TaskInterface, uintptr_t inputID,
                              const core::KeyType& key, const core::ValueType& valueData) override {
      // Process the input value to see if we should skip this command.
      BuildValue value = BuildValue::fromValue(valueData);

      // All direct inputs to NinjaCommandTask objects should be singleton
      // values.
      assert(!value.hasMultipleOutputs());

      // If the value is not an existing input or a successful command, then we
      // shouldn't run this command.
      if (!value.isExistingInput() && !value.isSuccessfulCommand()) {
        shouldSkip = true;
        if (value.isMissingInput()) {
          hasMissingInput = true;

          context.reportMissingInput(command->getInputs()[inputID]);
        }
      } else {
        // Otherwise, track the information used to determine if we can just
        // update the command instead of running it.
        const FileInfo& outputInfo = value.getOutputInfo();

        // If there is a missing input file (from a successful command), we
        // always need to run the command.
        if (outputInfo.isMissing()) {
          canUpdateIfNewer = false;
        } else {
          // Otherwise, keep track of the newest input.
          if (outputInfo.modTime > newestModTime) {
            newestModTime = outputInfo.modTime;
          }
        }
      }
    }